

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

BinaryenExpressionRef
BinaryenAtomicRMW(BinaryenModuleRef module,BinaryenOp op,BinaryenIndex bytes,BinaryenIndex offset,
                 BinaryenExpressionRef ptr,BinaryenExpressionRef value,BinaryenType type,
                 char *memoryName)

{
  AtomicRMW *this;
  string_view sVar1;
  
  sVar1 = (string_view)getMemoryName(module,memoryName);
  this = (AtomicRMW *)MixedArena::allocSpace(&module->allocator,0x40,8);
  *(undefined8 *)&(this->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression = 0;
  (this->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = 0;
  this->op = RMWAdd;
  this->bytes = '\0';
  *(undefined3 *)&this->field_0x15 = 0;
  (this->offset).addr = 0;
  this->ptr = (Expression *)0x0;
  this->value = (Expression *)0x0;
  (this->memory).super_IString.str._M_len = 0;
  (this->memory).super_IString.str._M_str = (char *)0x0;
  (this->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression._id = AtomicRMWId;
  this->op = op;
  this->bytes = (uint8_t)bytes;
  (this->offset).addr = (ulong)offset;
  this->ptr = ptr;
  this->value = value;
  (this->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = type;
  wasm::AtomicRMW::finalize(this);
  (this->memory).super_IString.str = sVar1;
  return (BinaryenExpressionRef)this;
}

Assistant:

BinaryenExpressionRef BinaryenAtomicRMW(BinaryenModuleRef module,
                                        BinaryenOp op,
                                        BinaryenIndex bytes,
                                        BinaryenIndex offset,
                                        BinaryenExpressionRef ptr,
                                        BinaryenExpressionRef value,
                                        BinaryenType type,
                                        const char* memoryName) {
  return static_cast<Expression*>(
    Builder(*(Module*)module)
      .makeAtomicRMW(AtomicRMWOp(op),
                     bytes,
                     offset,
                     (Expression*)ptr,
                     (Expression*)value,
                     Type(type),
                     getMemoryName(module, memoryName)));
}